

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

int __thiscall
google::protobuf::io::EpsCopyOutputStream::Flush(EpsCopyOutputStream *this,uint8 *ptr)

{
  int iVar1;
  uint8 *puVar2;
  int iVar3;
  size_t __n;
  
  while( true ) {
    iVar1 = (int)this->end_;
    iVar3 = (int)ptr;
    if (this->buffer_end_ == (uint8 *)0x0) {
      this->buffer_end_ = ptr;
      return (iVar1 - iVar3) + 0x10;
    }
    if (ptr <= this->end_) break;
    puVar2 = Next(this);
    ptr = puVar2 + (iVar3 - iVar1);
    if (this->had_error_ != false) {
      return 0;
    }
  }
  __n = (long)ptr - (long)this->buffer_;
  memcpy(this->buffer_end_,this->buffer_,__n);
  this->buffer_end_ = this->buffer_end_ + __n;
  return (int)this->end_ - iVar3;
}

Assistant:

int EpsCopyOutputStream::Flush(uint8* ptr) {
  while (buffer_end_ && ptr > end_) {
    int overrun = ptr - end_;
    GOOGLE_DCHECK(!had_error_);
    GOOGLE_DCHECK(overrun <= kSlopBytes);  // NOLINT
    ptr = Next() + overrun;
    if (had_error_) return 0;
  }
  int s;
  if (buffer_end_) {
    std::memcpy(buffer_end_, buffer_, ptr - buffer_);
    buffer_end_ += ptr - buffer_;
    s = end_ - ptr;
  } else {
    // The stream is writing directly in the ZeroCopyOutputStream buffer.
    s = end_ + kSlopBytes - ptr;
    buffer_end_ = ptr;
  }
  GOOGLE_DCHECK(s >= 0);  // NOLINT
  return s;
}